

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::loadBlockFromLowerLevel(Cache *this,uint32_t addr,uint32_t *cycles)

{
  byte extraout_AL;
  uint32_t set_id;
  uint32_t uVar1;
  uint uVar2;
  Block *this_00;
  reference pvVar3;
  int *in_RDX;
  uint in_ESI;
  Cache *in_RDI;
  double __x;
  Block replace_block;
  uint32_t replace_id;
  uint32_t i;
  uint32_t block_begin_addr;
  uint32_t mask;
  uint32_t bits;
  Block b;
  undefined5 in_stack_ffffffffffffff18;
  uint8_t in_stack_ffffffffffffff1d;
  uint8_t in_stack_ffffffffffffff1e;
  uint8_t in_stack_ffffffffffffff1f;
  undefined8 in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff49;
  undefined6 in_stack_ffffffffffffff4a;
  uint32_t in_stack_ffffffffffffff54;
  Cache *in_stack_ffffffffffffff58;
  uint32_t *in_stack_ffffffffffffff60;
  Block *in_stack_ffffffffffffff68;
  Cache *in_stack_ffffffffffffff70;
  uint local_84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_71;
  undefined1 local_48;
  undefined1 local_47;
  uint32_t local_44;
  uint32_t local_40;
  uint local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_30;
  int *local_18;
  uint local_c;
  
  uVar1 = (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_18 = in_RDX;
  local_c = in_ESI;
  Block::Block((Block *)0x104c48);
  local_48 = 1;
  local_47 = 0;
  set_id = getTag((Cache *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),uVar1);
  local_44 = set_id;
  uVar1 = getId((Cache *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),uVar1);
  local_3c = (in_RDI->policy).block_size;
  this_00 = (Block *)(ulong)local_3c;
  __x_00 = &local_71;
  local_40 = uVar1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x104cc6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(set_id,in_stack_ffffffffffffff40),(size_type)in_RDI,
             (allocator_type *)CONCAT44(uVar1,in_stack_ffffffffffffff30));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff30),__x_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff30));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x104d06);
  log2(__x);
  uVar2 = local_c & ((1 << (extraout_AL & 0x1f)) - 1U ^ 0xffffffff);
  for (local_84 = uVar2; local_84 < uVar2 + local_3c; local_84 = local_84 + 1) {
    if (in_RDI->lower_cache == (Cache *)0x0) {
      in_stack_ffffffffffffff1f =
           MemoryManager::getByteNoCache
                     ((MemoryManager *)CONCAT44(uVar1,in_stack_ffffffffffffff30),
                      (uint32_t)((ulong)__x_00 >> 0x20));
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&vStack_30,(ulong)(local_84 - uVar2));
      *pvVar3 = in_stack_ffffffffffffff1f;
    }
    else if (local_84 == uVar2) {
      in_stack_ffffffffffffff1e =
           getByte(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   (uint32_t *)
                   CONCAT62(in_stack_ffffffffffffff4a,
                            CONCAT11(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48)));
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&vStack_30,(ulong)(local_84 - uVar2));
      *pvVar3 = in_stack_ffffffffffffff1e;
    }
    else {
      in_stack_ffffffffffffff1d = getByteCopy(in_RDI,uVar1,(uint32_t *)__x_00);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&vStack_30,(ulong)(local_84 - uVar2));
      *pvVar3 = in_stack_ffffffffffffff1d;
    }
  }
  if (in_RDI->lower_cache == (Cache *)0x0) {
    (in_RDI->statistics).cycle_cnt = (in_RDI->statistics).cycle_cnt + 100;
    if (local_18 != (int *)0x0) {
      *local_18 = *local_18 + 100;
    }
  }
  else {
    (in_RDI->statistics).cycle_cnt =
         (in_RDI->lower_cache->policy).hit_latency + (in_RDI->statistics).cycle_cnt;
    if (local_18 != (int *)0x0) {
      *local_18 = (in_RDI->lower_cache->policy).hit_latency + *local_18;
    }
  }
  uVar1 = getReplacementBlockId
                    ((Cache *)CONCAT62(in_stack_ffffffffffffff4a,
                                       CONCAT11(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48)
                                      ),set_id);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[](&in_RDI->blocks,(ulong)uVar1)
  ;
  Block::Block((Block *)CONCAT44(set_id,in_stack_ffffffffffffff40),(Block *)in_RDI);
  if ((((in_RDI->write_back & 1U) != 0) && ((in_stack_ffffffffffffff48 & 1) != 0)) &&
     ((in_stack_ffffffffffffff49 & 1) != 0)) {
    writeBlockToLowerLevel
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[](&in_RDI->blocks,(ulong)uVar1)
  ;
  Block::operator=(this_00,(Block *)CONCAT17(in_stack_ffffffffffffff1f,
                                             CONCAT16(in_stack_ffffffffffffff1e,
                                                      CONCAT15(in_stack_ffffffffffffff1d,
                                                               in_stack_ffffffffffffff18))));
  Block::~Block((Block *)0x104fac);
  Block::~Block((Block *)0x104fb9);
  return;
}

Assistant:

void Cache::loadBlockFromLowerLevel(uint32_t addr, uint32_t *cycles) {
    // get block from memory or lower cache
    Block b;
    b.valid = true;
    b.dirty = false;
    b.tag = this->getTag(addr);
    b.id = this->getId(addr);
    b.size = this->policy.block_size;
    b.data = vector<uint8_t>(b.size);
    uint32_t bits = log2(b.size);
    uint32_t mask = ~((1 << bits) - 1);
    uint32_t block_begin_addr = addr & mask;
    for (uint32_t i = block_begin_addr; i < block_begin_addr + b.size; i++) {
        if (this->lower_cache == nullptr) {
            b.data[i - block_begin_addr] = this->memory->getByteNoCache(i);
        } else {
            if (i == block_begin_addr)
                b.data[i - block_begin_addr] = this->lower_cache->getByte(i, cycles);
            else
                b.data[i - block_begin_addr] = this->lower_cache->getByteCopy(i);
        }
    }
    if (this->lower_cache == nullptr) {
        this->statistics.cycle_cnt += 100;
        if (cycles)
            *cycles += 100;
    } else {
        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
        if (cycles)
            *cycles += this->lower_cache->policy.hit_latency;
    }

    // replace cache

    uint32_t replace_id = this->getReplacementBlockId(b.id);
    Block replace_block = this->blocks[replace_id];
    if (this->write_back && replace_block.valid && replace_block.dirty) {
        this->writeBlockToLowerLevel(replace_block, cycles);
    }
    this->blocks[replace_id] = b;
}